

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

Vat * __thiscall
capnp::_::anon_unknown_0::TestContext::initVat<capnproto_test::capnp::test::TestInterface::Client>
          (TestContext *this,StringPtr name,Client *bootstrap)

{
  _func_int *p_Var1;
  TestVat *network;
  Vat *pVVar2;
  Entry *pEVar3;
  Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t> local_68;
  Own<capnp::ClientHook,_std::nullptr_t> local_58;
  pointer_____offset_0x10___ *local_48;
  Own<capnp::ClientHook,_std::nullptr_t> local_40;
  
  network = TestNetwork::add(&this->network,name);
  pVVar2 = (Vat *)operator_new(0x18);
  p_Var1 = bootstrap->_vptr_Client[-3];
  local_58.disposer = *(Disposer **)((long)&bootstrap->_vptr_Client + (long)p_Var1);
  local_58.ptr = *(ClientHook **)(&bootstrap->field_0x8 + (long)p_Var1);
  *(undefined8 *)(&bootstrap->field_0x8 + (long)p_Var1) = 0;
  local_48 = &Capability::Client::typeinfo;
  pVVar2->vatNetwork = network;
  local_40.ptr = (ClientHook *)0x0;
  local_40.disposer = local_58.disposer;
  makeRpcServer<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
            ((capnp *)&pVVar2->rpcSystem,&network->super_TestVatBase,(Client *)&local_58);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_58);
  local_68.disposer =
       (Disposer *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestContext::Vat>::instance
  ;
  local_68.ptr = pVVar2;
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_40);
  pEVar3 = kj::
           HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>
           ::insert(&this->vats,name,&local_68);
  pVVar2 = (pEVar3->value).ptr;
  if (local_68.ptr != (Vat *)0x0) {
    (**(local_68.disposer)->_vptr_Disposer)();
  }
  return pVVar2;
}

Assistant:

Vat& initVat(kj::StringPtr name, T bootstrap) {
    // Create a vat with the given name and bootstrap capability.
    return *vats.insert(name, kj::heap<Vat>(network.add(name), kj::mv(bootstrap))).value;
  }